

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adiosCommMPI.cpp
# Opt level: O1

void __thiscall
adios2::helper::CommImplMPI::Allgatherv
          (CommImplMPI *this,void *sendbuf,size_t sendcount,Datatype sendtype,void *recvbuf,
          size_t *recvcounts,size_t *displs,Datatype recvtype,string *hint)

{
  int iVar1;
  size_type __n;
  vector<int,_std::allocator<int>_> displsInt;
  vector<int,_std::allocator<int>_> countsInt;
  
  countsInt.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  countsInt.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish
       = (pointer)0x0;
  countsInt.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  displsInt.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  displsInt.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  displsInt.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish
       = (pointer)0x0;
  iVar1 = (*(this->super_CommImpl)._vptr_CommImpl[8])();
  __n = (size_type)iVar1;
  std::vector<int,_std::allocator<int>_>::reserve(&countsInt,__n);
  std::
  transform<unsigned_long_const*,std::back_insert_iterator<std::vector<int,std::allocator<int>>>,adios2::helper::CommImplMPI::Allgatherv(void_const*,unsigned_long,adios2::helper::CommImpl::Datatype,void*,unsigned_long_const*,unsigned_long_const*,adios2::helper::CommImpl::Datatype,std::__cxx11::string_const&)const::__0>
            (recvcounts,recvcounts + __n,&countsInt);
  std::vector<int,_std::allocator<int>_>::reserve(&displsInt,__n);
  std::
  transform<unsigned_long_const*,std::back_insert_iterator<std::vector<int,std::allocator<int>>>,adios2::helper::CommImplMPI::Allgatherv(void_const*,unsigned_long,adios2::helper::CommImpl::Datatype,void*,unsigned_long_const*,unsigned_long_const*,adios2::helper::CommImpl::Datatype,std::__cxx11::string_const&)const::__0>
            (displs,displs + __n,&displsInt);
  iVar1 = MPI_Allgatherv(sendbuf,sendcount & 0xffffffff,
                         *(undefined8 *)
                          ((anonymous_namespace)::DatatypeToMPI + (long)(int)sendtype * 8),recvbuf,
                         countsInt.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_start,
                         displsInt.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_start,
                         *(undefined8 *)
                          ((anonymous_namespace)::DatatypeToMPI + (long)(int)recvtype * 8),
                         this->m_MPIComm);
  anon_unknown_1::CheckMPIReturn(iVar1,hint);
  if (displsInt.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(displsInt.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (countsInt.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(countsInt.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void CommImplMPI::Allgatherv(const void *sendbuf, size_t sendcount, Datatype sendtype,
                             void *recvbuf, const size_t *recvcounts, const size_t *displs,
                             Datatype recvtype, const std::string &hint) const
{
    std::vector<int> countsInt;
    std::vector<int> displsInt;
    {
        auto cast = [](size_t sz) -> int { return int(sz); };
        const int size = this->Size();
        countsInt.reserve(size);
        std::transform(recvcounts, recvcounts + size, std::back_inserter(countsInt), cast);
        displsInt.reserve(size);
        std::transform(displs, displs + size, std::back_inserter(displsInt), cast);
    }
    CheckMPIReturn(MPI_Allgatherv(sendbuf, static_cast<int>(sendcount), ToMPI(sendtype), recvbuf,
                                  countsInt.data(), displsInt.data(), ToMPI(recvtype), m_MPIComm),
                   hint);
}